

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void set_state(memdesc *desc,memstate state)

{
  guard *pgVar1;
  size_t sVar2;
  ulong local_30;
  size_t i;
  char *q;
  char *p;
  memstate state_local;
  memdesc *desc_local;
  
  pgVar1 = desc->data;
  sVar2 = desc->len;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    *(undefined1 *)((long)&pgVar1[1].desc + local_30 + sVar2) =
         *(undefined1 *)((long)&p + local_30 + 4);
  }
  desc->data->state = state;
  return;
}

Assistant:

static void
set_state(struct memdesc *desc, enum memstate state)
{
    char *p = (char *)(desc->data + 1) + desc->len;
    char *q = (char *)&state;
    q = (char *)&state;
    for (size_t i = 0; i < sizeof state; i++)
        p[i] = q[i];
    desc->data->state = state;
}